

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O1

int __thiscall CSound::Init(CSound *this)

{
  IKernel *pIVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  CConfig *pCVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar6;
  char *fmt;
  char *sys;
  long in_FS_OFFSET;
  SDL_AudioSpec Format;
  int local_38;
  undefined2 local_34;
  undefined1 local_32;
  undefined2 local_30;
  code *local_28;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  do {
    *(undefined4 *)((long)&m_aChannels[0].m_Vol + lVar4) = 0xff;
    *(undefined4 *)((long)&m_aChannels[1].m_Vol + lVar4) = 0xff;
    *(undefined4 *)((long)&m_aChannels[2].m_Vol + lVar4) = 0xff;
    *(undefined4 *)((long)&m_aChannels[3].m_Vol + lVar4) = 0xff;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  this->m_SoundEnabled = 0;
  pIVar1 = (this->super_IEngineSound).super_ISound.super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"config");
  pCVar5 = (CConfig *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                     ((long *)CONCAT44(extraout_var,iVar2));
  this->m_pConfig = pCVar5;
  pIVar1 = (this->super_IEngineSound).super_ISound.super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"enginegraphics");
  this->m_pGraphics = (IEngineGraphics *)CONCAT44(extraout_var_00,iVar2);
  pIVar1 = (this->super_IEngineSound).super_ISound.super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"storage");
  this->m_pStorage = (IStorage *)CONCAT44(extraout_var_01,iVar2);
  m_SoundLock = lock_create();
  if (this->m_pConfig->m_SndInit == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = SDL_InitSubSystem(0x10);
    if (iVar2 < 0) {
      uVar6 = SDL_GetError();
      sys = "gfx";
      fmt = "unable to init SDL audio: %s";
    }
    else {
      m_MixingRate = this->m_pConfig->m_SndRate;
      local_34 = 0x8010;
      local_32 = 2;
      local_30 = (undefined2)this->m_pConfig->m_SndBufferSize;
      local_28 = SdlCallback;
      local_20 = 0;
      iVar2 = 0;
      local_38 = m_MixingRate;
      iVar3 = SDL_OpenAudio(&local_38,0);
      if (-1 < iVar3) {
        dbg_msg("client/sound","sound init successful");
        iVar3 = this->m_pConfig->m_SndBufferSize;
        m_MaxFrames = iVar3 * 2;
        m_pMixBuffer = (int *)mem_alloc(iVar3 << 4);
        SDL_PauseAudio(0);
        this->m_SoundEnabled = 1;
        (*(this->super_IEngineSound).super_ISound.super_IInterface._vptr_IInterface[0xd])(this);
        goto LAB_0012f990;
      }
      uVar6 = SDL_GetError();
      sys = "client/sound";
      fmt = "unable to open audio: %s";
    }
    dbg_msg(sys,fmt,uVar6);
    iVar2 = -1;
  }
LAB_0012f990:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CSound::Init()
{
	for(int i = 0; i < NUM_CHANNELS; ++i)
		m_aChannels[i].m_Vol = 255;

	m_SoundEnabled = 0;
	m_pConfig = Kernel()->RequestInterface<IConfigManager>()->Values();
	m_pGraphics = Kernel()->RequestInterface<IEngineGraphics>();
	m_pStorage = Kernel()->RequestInterface<IStorage>();

	SDL_AudioSpec Format;

	m_SoundLock = lock_create();

	if(!m_pConfig->m_SndInit)
		return 0;

	if(SDL_InitSubSystem(SDL_INIT_AUDIO) < 0)
	{
		dbg_msg("gfx", "unable to init SDL audio: %s", SDL_GetError());
		return -1;
	}

	m_MixingRate = m_pConfig->m_SndRate;

	// Set 16-bit stereo audio at 22Khz
	Format.freq = m_pConfig->m_SndRate; // ignore_convention
	Format.format = AUDIO_S16; // ignore_convention
	Format.channels = 2; // ignore_convention
	Format.samples = m_pConfig->m_SndBufferSize; // ignore_convention
	Format.callback = SdlCallback; // ignore_convention
	Format.userdata = NULL; // ignore_convention

	// Open the audio device and start playing sound!
	if(SDL_OpenAudio(&Format, NULL) < 0)
	{
		dbg_msg("client/sound", "unable to open audio: %s", SDL_GetError());
		return -1;
	}
	else
		dbg_msg("client/sound", "sound init successful");

	m_MaxFrames = m_pConfig->m_SndBufferSize*2;
	m_pMixBuffer = (int *)mem_alloc(m_MaxFrames*2*sizeof(int));

	SDL_PauseAudio(0);

	m_SoundEnabled = 1;
	Update(); // update the volume
	return 0;
}